

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::~MemoryOutputStream
          (MemoryOutputStream *this)

{
  string *__k;
  string *psVar1;
  size_type sVar2;
  ulong uVar3;
  StringOutputStream *pSVar4;
  bool bVar5;
  mapped_type *ppbVar6;
  ulong uVar7;
  long lVar8;
  ostream *poVar9;
  mapped_type pbVar10;
  long lVar11;
  LogMessage *other;
  char *pcVar12;
  string *psVar13;
  int i;
  size_type sVar14;
  int iVar15;
  int iVar16;
  size_t __n;
  string *__dest;
  SubstituteArg *arg9;
  SubstituteArg *pSVar17;
  string indent_;
  LogMessage local_208;
  string magic_string;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  (this->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream =
       (_func_int **)&PTR__MemoryOutputStream_00425be8;
  internal::scoped_ptr<google::protobuf::io::StringOutputStream>::reset
            (&this->inner_,(StringOutputStream *)0x0);
  __k = &this->filename_;
  ppbVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
            ::operator[](&this->directory_->files_,__k);
  if ((this->insertion_point_)._M_string_length == 0) {
    if (*ppbVar6 == (mapped_type)0x0) {
      pbVar10 = (mapped_type)operator_new(0x20);
      (pbVar10->_M_dataplus)._M_p = (pointer)&pbVar10->field_2;
      pbVar10->_M_string_length = 0;
      (pbVar10->field_2)._M_local_buf[0] = '\0';
      *ppbVar6 = pbVar10;
      std::__cxx11::string::swap((string *)pbVar10);
      goto LAB_0023e1f2;
    }
    if (this->append_mode_ == true) {
      std::__cxx11::string::append((string *)*ppbVar6);
      goto LAB_0023e1f2;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)__k);
    poVar9 = std::operator<<(poVar9,": Tried to write the same file twice.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  else {
    psVar1 = &this->data_;
    sVar2 = (this->data_)._M_string_length;
    if ((sVar2 != 0) && ((psVar1->_M_dataplus)._M_p[sVar2 - 1] != '\n')) {
      std::__cxx11::string::push_back((char)psVar1);
    }
    arg9 = (SubstituteArg *)*ppbVar6;
    if (arg9 != (SubstituteArg *)0x0) {
      local_208._0_8_ = (this->insertion_point_)._M_dataplus._M_p;
      local_208.filename_._0_4_ = (undefined4)(this->insertion_point_)._M_string_length;
      indent_._M_dataplus._M_p = (pointer)0x0;
      indent_._M_string_length._0_4_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      local_60.text_ = (char *)0x0;
      local_60.size_ = -1;
      local_90.text_ = (char *)0x0;
      local_90.size_ = -1;
      local_c0.text_ = (char *)0x0;
      local_c0.size_ = -1;
      local_f0.text_ = (char *)0x0;
      local_f0.size_ = -1;
      local_120.text_ = (char *)0x0;
      local_120.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&magic_string,(strings *)"@@protoc_insertion_point($0)",(char *)&local_208,
                 (SubstituteArg *)&indent_,&local_1b0,&local_60,&local_90,&local_c0,&local_f0,
                 &local_120,&local_150,&local_180,arg9);
      uVar7 = std::__cxx11::string::find((string *)arg9,(ulong)&magic_string);
      if (uVar7 == 0xffffffffffffffff) {
        poVar9 = std::operator<<((ostream *)&std::cerr,(string *)__k);
        poVar9 = std::operator<<(poVar9,": insertion point \"");
        poVar9 = std::operator<<(poVar9,(string *)&this->insertion_point_);
        poVar9 = std::operator<<(poVar9,"\" not found.");
        std::endl<char,std::char_traits<char>>(poVar9);
        this->directory_->had_error_ = true;
      }
      else {
        if (uVar7 < 4) {
LAB_0023df28:
          lVar8 = std::__cxx11::string::rfind((char)arg9,10);
          psVar13 = (string *)(lVar8 + 1);
        }
        else {
          psVar13 = (string *)(uVar7 - 3);
          std::__cxx11::string::substr((ulong)&local_208,(ulong)arg9);
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_208,"/*");
          std::__cxx11::string::~string((string *)&local_208);
          if (!bVar5) goto LAB_0023df28;
        }
        pSVar17 = arg9;
        lVar8 = std::__cxx11::string::find_first_not_of((char *)arg9,0x3425da);
        std::__cxx11::string::string
                  ((string *)&indent_,(string *)arg9,(ulong)psVar13,lVar8 - (long)psVar13);
        if (CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length) == 0) {
          std::__cxx11::string::insert((ulong)pSVar17,psVar13);
        }
        else {
          sVar2 = (this->data_)._M_string_length;
          iVar16 = 0;
          for (sVar14 = 0; sVar2 != sVar14; sVar14 = sVar14 + 1) {
            iVar15 = 0;
            if ((this->data_)._M_dataplus._M_p[sVar14] == '\n') {
              iVar15 = (int)indent_._M_string_length;
            }
            iVar16 = iVar16 + iVar15;
          }
          std::__cxx11::string::insert((ulong)pSVar17,(ulong)psVar13,(char)sVar2 + (char)iVar16);
          lVar8._0_4_ = pSVar17->size_;
          lVar8._4_1_ = pSVar17->scratch_[0];
          lVar8._5_1_ = pSVar17->scratch_[1];
          lVar8._6_1_ = pSVar17->scratch_[2];
          lVar8._7_1_ = pSVar17->scratch_[3];
          if (lVar8 == 0) {
            pcVar12 = (char *)0x0;
          }
          else {
            pcVar12 = pSVar17->text_;
          }
          __dest = psVar13 + (long)pcVar12;
          uVar7 = 0;
          while (uVar3 = (this->data_)._M_string_length, uVar7 < uVar3) {
            memcpy(__dest,indent_._M_dataplus._M_p,
                   CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length));
            lVar8 = CONCAT44(indent_._M_string_length._4_4_,(int)indent_._M_string_length);
            lVar11 = std::__cxx11::string::find((char)psVar1,10);
            __n = (lVar11 + 1U) - uVar7;
            memcpy(__dest + lVar8,(psVar1->_M_dataplus)._M_p + uVar7,__n);
            __dest = __dest + lVar8 + __n;
            uVar7 = lVar11 + 1U;
          }
          lVar11._0_4_ = pSVar17->size_;
          lVar11._4_1_ = pSVar17->scratch_[0];
          lVar11._5_1_ = pSVar17->scratch_[1];
          lVar11._6_1_ = pSVar17->scratch_[2];
          lVar11._7_1_ = pSVar17->scratch_[3];
          if (lVar11 == 0) {
            pcVar12 = (char *)0x0;
          }
          else {
            pcVar12 = pSVar17->text_;
          }
          if (__dest != psVar13 + (long)(pcVar12 + uVar3 + (long)iVar16)) {
            internal::LogMessage::LogMessage
                      (&local_208,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/command_line_interface.cc"
                       ,0x2cc);
            other = internal::LogMessage::operator<<
                              (&local_208,
                               "CHECK failed: (target_ptr) == (string_as_array(target) + pos + data_.size() + indent_size): "
                              );
            internal::LogFinisher::operator=((LogFinisher *)&local_1b0,other);
            internal::LogMessage::~LogMessage(&local_208);
          }
        }
        std::__cxx11::string::~string((string *)&indent_);
      }
      std::__cxx11::string::~string((string *)&magic_string);
      goto LAB_0023e1f2;
    }
    poVar9 = std::operator<<((ostream *)&std::cerr,(string *)__k);
    poVar9 = std::operator<<(poVar9,": Tried to insert into file that doesn\'t exist.");
    std::endl<char,std::char_traits<char>>(poVar9);
  }
  this->directory_->had_error_ = true;
LAB_0023e1f2:
  pSVar4 = (this->inner_).ptr_;
  if (pSVar4 != (StringOutputStream *)0x0) {
    (*(pSVar4->super_ZeroCopyOutputStream)._vptr_ZeroCopyOutputStream[1])();
  }
  std::__cxx11::string::~string((string *)&this->data_);
  std::__cxx11::string::~string((string *)&this->insertion_point_);
  std::__cxx11::string::~string((string *)__k);
  io::ZeroCopyOutputStream::~ZeroCopyOutputStream(&this->super_ZeroCopyOutputStream);
  return;
}

Assistant:

CommandLineInterface::MemoryOutputStream::~MemoryOutputStream() {
  // Make sure all data has been written.
  inner_.reset();

  // Insert into the directory.
  string** map_slot = &directory_->files_[filename_];

  if (insertion_point_.empty()) {
    // This was just a regular Open().
    if (*map_slot != NULL) {
      if (append_mode_) {
        (*map_slot)->append(data_);
      } else {
        std::cerr << filename_ << ": Tried to write the same file twice."
                  << std::endl;
        directory_->had_error_ = true;
      }
      return;
    }

    *map_slot = new string;
    (*map_slot)->swap(data_);
  } else {
    // This was an OpenForInsert().

    // If the data doesn't end with a clean line break, add one.
    if (!data_.empty() && data_[data_.size() - 1] != '\n') {
      data_.push_back('\n');
    }

    // Find the file we are going to insert into.
    if (*map_slot == NULL) {
      std::cerr << filename_
                << ": Tried to insert into file that doesn't exist."
                << std::endl;
      directory_->had_error_ = true;
      return;
    }
    string* target = *map_slot;

    // Find the insertion point.
    string magic_string = strings::Substitute(
        "@@protoc_insertion_point($0)", insertion_point_);
    string::size_type pos = target->find(magic_string);

    if (pos == string::npos) {
      std::cerr << filename_ << ": insertion point \"" << insertion_point_
                << "\" not found." << std::endl;
      directory_->had_error_ = true;
      return;
    }

    if ((pos > 3) && (target->substr(pos - 3, 2) == "/*")) {
      // Support for inline "/* @@protoc_insertion_point() */"
      pos = pos - 3;
    } else {
      // Seek backwards to the beginning of the line, which is where we will
      // insert the data.  Note that this has the effect of pushing the
      // insertion point down, so the data is inserted before it.  This is
      // intentional because it means that multiple insertions at the same point
      // will end up in the expected order in the final output.
      pos = target->find_last_of('\n', pos);
      if (pos == string::npos) {
        // Insertion point is on the first line.
        pos = 0;
      } else {
        // Advance to character after '\n'.
        ++pos;
      }
    }

    // Extract indent.
    string indent_(*target, pos, target->find_first_not_of(" \t", pos) - pos);

    if (indent_.empty()) {
      // No indent.  This makes things easier.
      target->insert(pos, data_);
    } else {
      // Calculate how much space we need.
      int indent_size = 0;
      for (int i = 0; i < data_.size(); i++) {
        if (data_[i] == '\n') indent_size += indent_.size();
      }

      // Make a hole for it.
      target->insert(pos, data_.size() + indent_size, '\0');

      // Now copy in the data.
      string::size_type data_pos = 0;
      char* target_ptr = string_as_array(target) + pos;
      while (data_pos < data_.size()) {
        // Copy indent.
        memcpy(target_ptr, indent_.data(), indent_.size());
        target_ptr += indent_.size();

        // Copy line from data_.
        // We already guaranteed that data_ ends with a newline (above), so this
        // search can't fail.
        string::size_type line_length =
            data_.find_first_of('\n', data_pos) + 1 - data_pos;
        memcpy(target_ptr, data_.data() + data_pos, line_length);
        target_ptr += line_length;
        data_pos += line_length;
      }

      GOOGLE_CHECK_EQ(target_ptr,
          string_as_array(target) + pos + data_.size() + indent_size);
    }
  }
}